

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

Gia_Man_t * Gia_SweeperFraigTest(Gia_Man_t *pInit,int nWords,int nConfs,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *pGia;
  Vec_Int_t *vProbeOuts;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar5;
  int v;
  
  pGia = Gia_ManDupOneHot(pInit);
  Gia_SweeperStart(pGia);
  vProbeOuts = Vec_IntAlloc(pGia->vCos->nSize - pGia->nRegs);
  for (v = 0; v < pGia->vCos->nSize - pGia->nRegs; v = v + 1) {
    pObj = Gia_ManCo(pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = pGia->vCos->nSize;
    iVar2 = pGia->nRegs;
    iVar3 = pGia->nConstrs;
    iVar4 = Gia_ObjFaninLit0p(pGia,pObj);
    iVar4 = Gia_SweeperProbeCreate(pGia,iVar4);
    if (v < iVar1 - (iVar2 + iVar3)) {
      Vec_IntPush(vProbeOuts,iVar4);
    }
    else {
      Gia_SweeperCondPush(pGia,iVar4);
    }
  }
  pGVar5 = Gia_SweeperSweep(pGia,vProbeOuts,nWords,nConfs,fVerbose,0);
  Vec_IntFree(vProbeOuts);
  Gia_SweeperStop(pGia);
  Gia_ManStop(pGia);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_SweeperFraigTest( Gia_Man_t * pInit, int nWords, int nConfs, int fVerbose )
{
    Gia_Man_t * p, * pGia;
    Gia_Obj_t * pObj;
    Vec_Int_t * vOuts;
    int i;
    // add one-hotness constraints
    p = Gia_ManDupOneHot( pInit );
    // create sweeper
    Gia_SweeperStart( p );
    // collect outputs and create conditions
    vOuts = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
        if ( i < Gia_ManPoNum(p) - p->nConstrs )  // this is the user's output
            Vec_IntPush( vOuts, Gia_SweeperProbeCreate( p,  Gia_ObjFaninLit0p(p, pObj) ) );
        else // this is a constraint
            Gia_SweeperCondPush( p, Gia_SweeperProbeCreate( p, Gia_ObjFaninLit0p(p, pObj) ) );
    // perform the sweeping
    pGia = Gia_SweeperSweep( p, vOuts, nWords, nConfs, fVerbose, 0 );
//    pGia = Gia_ManDup( p );
    Vec_IntFree( vOuts );
    // sop the sweeper
    Gia_SweeperStop( p );
    Gia_ManStop( p );
    return pGia;
}